

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall position::do_move(position *this,Move *m)

{
  info *ifo;
  U64 *pUVar1;
  U16 *pUVar2;
  byte bVar3;
  byte bVar4;
  Color CVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  undefined2 uVar9;
  ushort uVar10;
  ulong uVar11;
  U64 UVar12;
  long lVar13;
  info *piVar14;
  Color *pCVar15;
  bool *pbVar16;
  Color *pCVar17;
  Color local_4c;
  Color local_48;
  Color us;
  Square to;
  Square from;
  Piece p;
  undefined4 local_34;
  
  ifo = &this->ifo;
  UVar12 = this->hidx;
  this->hidx = UVar12 + 1;
  pbVar16 = &this->history[UVar12 - 1].incheck;
  piVar14 = ifo;
  for (lVar13 = 0xc; pbVar16 = pbVar16 + 8, lVar13 != 0; lVar13 = lVar13 + -1) {
    *(U64 *)pbVar16 = piVar14->checkers;
    piVar14 = (info *)piVar14->pinned;
  }
  bVar7 = m->f;
  from = (Square)bVar7;
  bVar3 = m->t;
  to = (Square)bVar3;
  bVar4 = m->type;
  p = (this->pcs).piece_on._M_elems[bVar7];
  us = (this->ifo).stm;
  uVar11 = (ulong)us;
  if (p == rook) {
    if (uVar11 == 1) {
      uVar10 = (this->ifo).cmask;
      if ((uVar10 & 0xc) != 0) {
        if (from == H8) {
          (this->ifo).cmask = uVar10 & 0xb;
          local_4c = black;
          local_48 = CONCAT22(local_48._2_2_,0xb);
          UVar12 = zobrist::castle(&local_4c,(U16 *)&local_48);
          pUVar1 = &(this->ifo).key;
          *pUVar1 = *pUVar1 ^ UVar12;
          local_4c = black;
          uVar9 = 0xb;
        }
        else {
          if (bVar7 != 0x38) goto LAB_0011d1b2;
          (this->ifo).cmask = uVar10 & 7;
          local_4c = black;
          local_48 = CONCAT22(local_48._2_2_,7);
          UVar12 = zobrist::castle(&local_4c,(U16 *)&local_48);
          pUVar1 = &(this->ifo).key;
          *pUVar1 = *pUVar1 ^ UVar12;
          local_4c = black;
          uVar9 = 7;
        }
        goto LAB_0011d197;
      }
    }
    else if ((us == white) && (uVar10 = (this->ifo).cmask, (uVar10 & 3) != 0)) {
      if (bVar7 == 7) {
        (this->ifo).cmask = uVar10 & 0xe;
        local_4c = white;
        local_48 = CONCAT22(local_48._2_2_,0xe);
        UVar12 = zobrist::castle(&local_4c,(U16 *)&local_48);
        pUVar1 = &(this->ifo).key;
        *pUVar1 = *pUVar1 ^ UVar12;
        local_4c = white;
        uVar9 = 0xe;
      }
      else {
        if (bVar7 != 0) goto LAB_0011d1b2;
        (this->ifo).cmask = uVar10 & 0xd;
        local_4c = white;
        local_48 = CONCAT22(local_48._2_2_,0xd);
        UVar12 = zobrist::castle(&local_4c,(U16 *)&local_48);
        pUVar1 = &(this->ifo).key;
        *pUVar1 = *pUVar1 ^ UVar12;
        local_4c = white;
        uVar9 = 0xd;
      }
LAB_0011d197:
      local_48 = CONCAT22(local_48._2_2_,uVar9);
      pCVar17 = &local_4c;
      pCVar15 = &local_48;
      goto LAB_0011d1a6;
    }
  }
  else if (p == king) {
    (this->pcs).king_sq._M_elems[uVar11] = to;
    (this->ifo).ks[uVar11] = (uint)bVar3;
    uVar10 = (this->ifo).cmask;
    if (((uint)(uVar11 == 0) * 3 - 5 | (uint)uVar10) != 0xffffffff) {
      uVar6 = 0xfffffff7;
      if (uVar11 == 0) {
        uVar6 = 0xfffffffd;
      }
      if ((uVar6 | uVar10) != 0xffffffff) goto LAB_0011d1b2;
    }
    (this->ifo).cmask = uVar10 & (ushort)(uVar11 == 0) * 9 + 3;
    if (uVar11 == 0) {
      local_4c = white;
      local_34._2_2_ = 0xc;
      UVar12 = zobrist::castle(&local_4c,(U16 *)((long)&local_34 + 2));
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar12;
      local_4c = white;
      local_34._2_2_ = 0xc;
      pCVar17 = &local_4c;
      pCVar15 = (Color *)((long)&local_34 + 2);
    }
    else {
      local_48 = black;
      local_34._0_2_ = no_color;
      UVar12 = zobrist::castle(&local_48,(U16 *)&local_34);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar12;
      local_48 = black;
      local_34._0_2_ = no_color;
      pCVar17 = &local_48;
      pCVar15 = &local_34;
    }
LAB_0011d1a6:
    UVar12 = zobrist::castle(pCVar17,(U16 *)pCVar15);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar12;
  }
LAB_0011d1b2:
  (this->ifo).captured = no_piece;
  if (bVar4 == 0xc) {
    (this->ifo).captured = pawn;
    piece_data::do_ep(&this->pcs,&us,&from,&to,ifo);
  }
  else if (bVar4 == 0xb) {
    (this->ifo).captured = (this->pcs).piece_on._M_elems[bVar3];
    piece_data::do_cap(&this->pcs,&us,&p,&from,&to,ifo);
  }
  else if (bVar4 == 10) {
    piece_data::do_quiet(&this->pcs,&us,&p,&from,&to,ifo);
  }
  else if (bVar4 < 4) {
    if (bVar4 == 0) {
      local_4c = 4;
    }
    else if (bVar4 == 1) {
      local_4c = no_color;
    }
    else {
      local_4c = (bVar4 == 2) + black;
    }
    piece_data::do_promotion(&this->pcs,&us,&local_4c,&from,&to,ifo);
  }
  else if (bVar4 < 8) {
    (this->ifo).captured = (this->pcs).piece_on._M_elems[(uint)bVar3];
    if (bVar4 == 4) {
      local_4c = 4;
    }
    else if (bVar4 == 5) {
      local_4c = no_color;
    }
    else {
      local_4c = (bVar4 == 6) + black;
    }
    piece_data::do_promotion_cap(&this->pcs,&us,&local_4c,&from,&to,ifo);
  }
  else {
    if (bVar4 == 9) {
      piece_data::do_castle_qs(&this->pcs,&us,&from,&to,ifo);
    }
    else {
      if (bVar4 != 8) goto LAB_0011d373;
      piece_data::do_castle_ks(&this->pcs,&us,&from,&to,ifo);
    }
    pUVar2 = &(this->ifo).cmask;
    *pUVar2 = *pUVar2 & (ushort)((ulong)us == 0) * 9 + 3;
    (this->ifo).has_castled[us] = true;
  }
LAB_0011d373:
  pCVar17 = &(this->ifo).stm;
  (this->ifo).eps = no_square;
  if (p == pawn) {
    if (((from - to) + 0x10 & 0xffffffdf) == 0) {
      (this->ifo).eps = (from + (uint)(us == white) * 0x10) - A2;
      local_4c = CONCAT31(local_4c._1_3_,(char)to) & 0xffffff07;
      UVar12 = zobrist::ep((U8 *)&local_4c);
      pUVar1 = &(this->ifo).key;
      *pUVar1 = *pUVar1 ^ UVar12;
      local_4c = CONCAT31(local_4c._1_3_,(undefined1)to) & 0xffffff07;
      UVar12 = zobrist::ep((U8 *)&local_4c);
      pUVar1 = &(this->ifo).repkey;
      *pUVar1 = *pUVar1 ^ UVar12;
      bVar8 = p == pawn;
      goto LAB_0011d3f9;
    }
  }
  else {
    bVar8 = false;
LAB_0011d3f9:
    if (!(bool)(bVar4 == 0xb | bVar8)) {
      bVar7 = (this->ifo).move50 + 1;
      (this->ifo).move50 = bVar7;
      uVar10 = (ushort)bVar7;
      goto LAB_0011d423;
    }
  }
  (this->ifo).move50 = '\0';
  uVar10 = 0;
LAB_0011d423:
  local_4c = CONCAT22(local_4c._2_2_,uVar10);
  UVar12 = zobrist::mv50((U16 *)&local_4c);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar12;
  pUVar2 = &(this->ifo).hmvs;
  *pUVar2 = *pUVar2 + 1;
  UVar12 = zobrist::hmvs(&(this->ifo).hmvs);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar12;
  pCVar15 = &(this->ifo).stm;
  *(undefined1 *)pCVar15 = (char)*pCVar15 ^ black;
  UVar12 = zobrist::stm(pCVar17);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar12;
  UVar12 = zobrist::stm(pCVar17);
  pUVar1 = &(this->ifo).repkey;
  *pUVar1 = *pUVar1 ^ UVar12;
  local_4c = (this->ifo).ks[(this->ifo).stm];
  UVar12 = 0;
  bVar8 = is_attacked(this,&local_4c,pCVar17,&us,0);
  (this->ifo).incheck = bVar8;
  if (bVar8) {
    CVar5 = (this->ifo).stm;
    local_4c = (this->ifo).ks[CVar5];
    local_48 = CVar5 ^ black;
    UVar12 = attackers_of2(this,&local_4c,&local_48);
  }
  (this->ifo).checkers = UVar12;
  UVar12 = pinned(this,(this->ifo).stm);
  CVar5 = (this->ifo).stm;
  (this->ifo).pinned[CVar5] = UVar12;
  UVar12 = pinned(this,CVar5 ^ black);
  (this->ifo).pinned[(long)(int)(this->ifo).stm ^ 1] = UVar12;
  this->nodes_searched = this->nodes_searched + 1;
  return;
}

Assistant:

void position::do_move(const Move& m) {
	history[hidx++] = ifo;
	const Square from = Square(m.f);
	const Square to = Square(m.t);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = to_move();

	// king square update and castle rights update
	if (p == king) {
		pcs.king_sq[us] = to;
		ifo.ks[us] = to;
		if (can_castle_ks() || can_castle_qs()) {
			ifo.cmask &= (us == white ? clearw : clearb);
			ifo.key ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
			ifo.repkey ^= (us == white ? zobrist::castle(white, clearw) : zobrist::castle(black, clearb));
		}
	}
	else if (p == rook) {
		if (us == white && can_castle<white>()) {
			if (from == A1) {
				ifo.cmask &= clearwqs;
				ifo.key ^= zobrist::castle(white, clearwqs);
				ifo.repkey ^= zobrist::castle(white, clearwqs);
			}
			else if (from == H1) {
				ifo.cmask &= clearwks;
				ifo.key ^= zobrist::castle(white, clearwks);
				ifo.repkey ^= zobrist::castle(white, clearwks);
			}
		}
		else if (us == black && can_castle<black>()) {
			if (from == A8) {
				ifo.cmask &= clearbqs;
				ifo.key ^= zobrist::castle(black, clearbqs);
				ifo.repkey ^= zobrist::castle(black, clearbqs);
			}
			else if (from == H8) {
				ifo.cmask &= clearbks;
				ifo.key ^= zobrist::castle(black, clearbks);
				ifo.repkey ^= zobrist::castle(black, clearbks);
			}
		}
	}

	ifo.captured = no_piece;

	if (t == quiet) {
		pcs.do_quiet(us, p, from, to, ifo);
	}

	else if (t == capture) {
		ifo.captured = piece_on(to);
		pcs.do_cap(us, p, from, to, ifo);
	}

	else if (t == ep) {
		ifo.captured = pawn;
		pcs.do_ep(us, from, to, ifo);
	}

	else if (t < capture_promotion_q) pcs.do_promotion(us, (t == promotion_q ? queen :
		t == promotion_r ? rook :
		t == promotion_b ? bishop :
		knight), from, to, ifo);

	else if (t < castle_ks) {
		ifo.captured = piece_on(to);
		pcs.do_promotion_cap(us, (t == capture_promotion_q ? queen :
			t == capture_promotion_r ? rook :
			t == capture_promotion_b ? bishop :
			knight), from, to, ifo);
	}

	else if (t == castle_ks) {
		pcs.do_castle_ks(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	else if (t == castle_qs) {
		pcs.do_castle_qs(us, from, to, ifo);
		ifo.cmask &= (us == white ? clearw : clearb);
		ifo.has_castled[us] = true;
	}

	// eps
	ifo.eps = no_square;
	if (p == pawn && abs(from - to) == 16) {
		ifo.eps = Square(from + (us == white ? 8 : -8));
		ifo.key ^= zobrist::ep(util::col(to));
		ifo.repkey ^= zobrist::ep(util::col(to));
	}

	// move50
	if (p == pawn || t == capture) ifo.move50 = 0;
	else ifo.move50++;
	ifo.key ^= zobrist::mv50(ifo.move50);

	// half-moves
	ifo.hmvs++;
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// side to move
	ifo.stm = Color(ifo.stm ^ 1);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	ifo.incheck = is_attacked(king_square(), ifo.stm, us);
	ifo.checkers = (ifo.incheck ? attackers_of2(king_square(), Color(ifo.stm ^ 1)) : 0ULL);
	ifo.pinned[ifo.stm] = pinned(ifo.stm);
	ifo.pinned[ifo.stm ^ 1] = pinned(Color(ifo.stm ^ 1));
	++nodes_searched;
}